

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PVector::PVector(PVector *this)

{
  PArray::PArray(&this->super_PArray,(PType *)TypeFloat32,3);
  (this->super_PArray).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007c8060;
  return;
}

Assistant:

PVector::PVector()
: PArray(TypeFloat32, 3)
{
}